

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-copyfile.c
# Opt level: O3

int run_test_fs_copyfile(void)

{
  long lVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  char *req_00;
  ulong uVar5;
  uv_fs_t *req_01;
  uv_fs_t *puVar6;
  code *pcVar7;
  char *unaff_R12;
  char *pcVar8;
  char *pcVar9;
  code *pcVar10;
  code *unaff_R15;
  char *pcVar11;
  code *pcVar12;
  char src [14];
  uv_fs_t req;
  undefined1 auStack_5c8 [120];
  long lStack_550;
  long lStack_520;
  ulong uStack_410;
  char *pcStack_408;
  code *pcStack_400;
  code *pcStack_3f8;
  undefined8 uStack_3f0;
  undefined1 auStack_3e0 [16];
  undefined1 auStack_3d0 [440];
  uv_fs_t *puStack_218;
  char *pcStack_210;
  undefined6 uStack_1e8;
  undefined2 local_1e2;
  undefined6 uStack_1e0;
  uv_fs_t local_1d8;
  
  pcVar11 = (char *)&uStack_1e8;
  pcVar9 = (char *)&uStack_1e8;
  pcVar12 = (code *)&uStack_1e8;
  pcVar8 = (char *)&uStack_1e8;
  uStack_1e0 = 0x6372735f65;
  uStack_1e8 = 0x665f74736574;
  local_1e2 = 0x6c69;
  req_00 = (char *)uv_default_loop();
  req_01 = &local_1d8;
  puVar6 = (uv_fs_t *)0x0;
  iVar3 = uv_fs_copyfile(0,req_01,&uStack_1e8,"test_file_dst",0xffffffff,0);
  if (iVar3 == -0x16) {
    req_01 = &local_1d8;
    uv_fs_req_cleanup(req_01);
    unlink((char *)&uStack_1e8);
    unaff_R12 = "test_file_dst";
    unlink("test_file_dst");
    puVar6 = (uv_fs_t *)0x0;
    iVar3 = uv_fs_copyfile(0,req_01,&uStack_1e8,"test_file_dst",0,0);
    unaff_R15 = (code *)&uStack_1e8;
    if (local_1d8.result != -2) goto LAB_001502f8;
    unaff_R15 = (code *)&uStack_1e8;
    if (iVar3 != -2) goto LAB_001502fd;
    req_01 = &local_1d8;
    uv_fs_req_cleanup(req_01);
    puVar6 = (uv_fs_t *)0x0;
    iVar3 = uv_fs_stat(0,req_01,"test_file_dst",0);
    unaff_R15 = (code *)&uStack_1e8;
    if (iVar3 == 0) goto LAB_00150302;
    req_01 = &local_1d8;
    uv_fs_req_cleanup(req_01);
    touch_file((char *)&uStack_1e8,0xc);
    puVar6 = (uv_fs_t *)0x0;
    iVar3 = uv_fs_copyfile(0,req_01,&uStack_1e8,&uStack_1e8,0,0);
    if (iVar3 != 0) goto LAB_00150307;
    req_01 = &local_1d8;
    uv_fs_req_cleanup(req_01);
    unlink((char *)&uStack_1e8);
    pcVar11 = "test_file_dst";
    unlink("test_file_dst");
    puVar6 = (uv_fs_t *)0x0;
    iVar3 = uv_fs_copyfile(0,req_01,"test/fixtures/load_error.node","test_file_dst",0,0);
    if (iVar3 != 0) goto LAB_0015030c;
    req_01 = &local_1d8;
    handle_result(req_01);
    pcVar11 = "test_file_dst";
    unlink("test_file_dst");
    touch_file((char *)&uStack_1e8,0);
    puVar6 = (uv_fs_t *)0x0;
    iVar3 = uv_fs_copyfile(0,req_01,&uStack_1e8,"test_file_dst",0,0);
    if (iVar3 != 0) goto LAB_00150311;
    req_01 = &local_1d8;
    handle_result(req_01);
    puVar6 = (uv_fs_t *)0x0;
    iVar3 = uv_fs_copyfile(0,req_01,"test/fixtures/load_error.node","test_file_dst",0,0);
    pcVar9 = (char *)&uStack_1e8;
    if (iVar3 != 0) goto LAB_00150316;
    req_01 = &local_1d8;
    handle_result(req_01);
    puVar6 = (uv_fs_t *)0x0;
    iVar3 = uv_fs_copyfile(0,req_01,"test/fixtures/load_error.node","test_file_dst",1,0);
    pcVar9 = (char *)&uStack_1e8;
    pcVar10 = (code *)pcVar11;
    if (iVar3 != -0x11) goto LAB_0015031b;
    req_01 = &local_1d8;
    uv_fs_req_cleanup(req_01);
    touch_file((char *)&uStack_1e8,1);
    puVar6 = (uv_fs_t *)0x0;
    iVar3 = uv_fs_copyfile(0,req_01,&uStack_1e8,"test_file_dst",0,0);
    pcVar9 = (char *)&uStack_1e8;
    if (iVar3 != 0) goto LAB_00150320;
    req_01 = &local_1d8;
    handle_result(req_01);
    unlink("test_file_dst");
    touch_file((char *)&uStack_1e8,0x2000);
    puVar6 = (uv_fs_t *)0x0;
    iVar3 = uv_fs_copyfile(0,req_01,&uStack_1e8,"test_file_dst",0,0);
    pcVar12 = (code *)"test_file_dst";
    if (iVar3 != 0) goto LAB_00150325;
    req_01 = &local_1d8;
    handle_result(req_01);
    pcVar12 = handle_result;
    unlink((char *)&uStack_1e8);
    pcVar8 = "test_file_dst";
    unlink("test_file_dst");
    puVar6 = (uv_fs_t *)req_00;
    iVar3 = uv_fs_copyfile(req_00,req_01,"test/fixtures/load_error.node","test_file_dst",0,
                           handle_result);
    if (iVar3 != 0) goto LAB_0015032a;
    if (result_check_count != 5) goto LAB_0015032f;
    req_01 = (uv_fs_t *)0x0;
    puVar6 = (uv_fs_t *)req_00;
    uv_run(req_00);
    if (result_check_count != 6) goto LAB_00150334;
    unlink("test_file_dst");
    req_01 = &local_1d8;
    puVar6 = (uv_fs_t *)req_00;
    iVar3 = uv_fs_copyfile(req_00,req_01,"test/fixtures/load_error.node","test_file_dst",0xffffffff,
                           fail_cb);
    if (iVar3 != -0x16) goto LAB_00150339;
    uv_run(req_00,0);
    req_00 = "test_file_dst";
    unlink("test_file_dst");
    req_01 = &local_1d8;
    puVar6 = (uv_fs_t *)0x0;
    iVar3 = uv_fs_copyfile(0,req_01,"test/fixtures/load_error.node","test_file_dst",2,0);
    if (iVar3 != 0) goto LAB_0015033e;
    req_00 = (char *)&local_1d8;
    handle_result((uv_fs_t *)req_00);
    unlink("test_file_dst");
    puVar6 = (uv_fs_t *)0x0;
    req_01 = (uv_fs_t *)req_00;
    iVar3 = uv_fs_copyfile(0,req_00,"test/fixtures/load_error.node","test_file_dst",4,0);
    if (0 < iVar3) goto LAB_00150343;
    if (iVar3 == 0) {
      handle_result(&local_1d8);
    }
    req_00 = "test_file_dst";
    unlink("test_file_dst");
    touch_file("test_file_dst",0);
    chmod("test_file_dst",0x124);
    req_01 = &local_1d8;
    puVar6 = (uv_fs_t *)0x0;
    iVar3 = uv_fs_copyfile(0,req_01,"test/fixtures/load_error.node","test_file_dst",0,0);
    if (local_1d8.result != -0xd) goto LAB_00150348;
    if (iVar3 == -0xd) {
      uv_fs_req_cleanup(&local_1d8);
      unlink("test_file_dst");
      return 0;
    }
  }
  else {
    run_test_fs_copyfile_cold_1();
LAB_001502f8:
    run_test_fs_copyfile_cold_2();
LAB_001502fd:
    run_test_fs_copyfile_cold_3();
LAB_00150302:
    pcVar11 = (char *)unaff_R15;
    run_test_fs_copyfile_cold_19();
LAB_00150307:
    run_test_fs_copyfile_cold_4();
LAB_0015030c:
    pcVar9 = unaff_R12;
    run_test_fs_copyfile_cold_5();
LAB_00150311:
    run_test_fs_copyfile_cold_6();
LAB_00150316:
    run_test_fs_copyfile_cold_7();
    pcVar10 = (code *)pcVar11;
LAB_0015031b:
    pcVar12 = pcVar10;
    run_test_fs_copyfile_cold_8();
LAB_00150320:
    pcVar8 = pcVar9;
    run_test_fs_copyfile_cold_9();
LAB_00150325:
    run_test_fs_copyfile_cold_10();
LAB_0015032a:
    run_test_fs_copyfile_cold_11();
LAB_0015032f:
    run_test_fs_copyfile_cold_12();
LAB_00150334:
    run_test_fs_copyfile_cold_13();
LAB_00150339:
    run_test_fs_copyfile_cold_14();
LAB_0015033e:
    run_test_fs_copyfile_cold_15();
LAB_00150343:
    run_test_fs_copyfile_cold_16();
LAB_00150348:
    run_test_fs_copyfile_cold_17();
  }
  run_test_fs_copyfile_cold_18();
  pcVar10 = (code *)auStack_3d0;
  pcStack_3f8 = (code *)0x150385;
  puStack_218 = (uv_fs_t *)req_00;
  pcStack_210 = pcVar8;
  uVar4 = uv_fs_open(0,pcVar10,puVar6,0x241,0x180,0);
  pcStack_3f8 = (code *)0x15038f;
  pcVar7 = pcVar10;
  uv_fs_req_cleanup();
  if ((int)uVar4 < 0) {
LAB_00150434:
    pcStack_3f8 = (code *)0x150439;
    touch_file_cold_1();
  }
  else {
    pcStack_3f8 = (code *)0x1503a8;
    auStack_3e0 = uv_buf_init("a",1);
    if ((int)req_01 != 0) {
      pcVar10 = (code *)0x0;
      pcVar12 = (code *)auStack_3d0;
      pcVar8 = auStack_3e0;
      do {
        uStack_3f0 = 0;
        pcStack_3f8 = (code *)0x1503e6;
        iVar3 = uv_fs_write(0,pcVar12,uVar4,pcVar8,1,pcVar10);
        pcStack_3f8 = (code *)0x1503f0;
        pcVar7 = pcVar12;
        uv_fs_req_cleanup();
        if (iVar3 < 0) {
          pcStack_3f8 = (code *)0x150434;
          touch_file_cold_2();
          goto LAB_00150434;
        }
        pcVar10 = pcVar10 + 1;
      } while ((code *)((ulong)req_01 & 0xffffffff) != pcVar10);
    }
    pcVar10 = (code *)auStack_3d0;
    pcStack_3f8 = (code *)0x15040f;
    uVar4 = uv_fs_close(0,pcVar10,uVar4,0);
    pcStack_3f8 = (code *)0x150419;
    pcVar7 = pcVar10;
    iVar3 = uv_fs_req_cleanup();
    if (uVar4 == 0) {
      return iVar3;
    }
  }
  uVar5 = (ulong)uVar4;
  pcStack_3f8 = handle_result;
  touch_file_cold_3();
  uStack_410 = uVar5;
  pcStack_408 = pcVar8;
  pcStack_400 = pcVar10;
  pcStack_3f8 = pcVar12;
  if (*(int *)(pcVar7 + 0x40) == 0x1d) {
    if (*(long *)(pcVar7 + 0x58) != 0) goto LAB_001504dc;
    iVar3 = uv_fs_stat(0,auStack_5c8,*(undefined8 *)(pcVar7 + 0x68),0);
    lVar2 = lStack_520;
    lVar1 = lStack_550;
    if (iVar3 != 0) goto LAB_001504e1;
    uv_fs_req_cleanup(auStack_5c8);
    iVar3 = uv_fs_stat(0,auStack_5c8,"test_file_dst",0);
    if (iVar3 != 0) goto LAB_001504e6;
    if (lStack_520 == lVar2) {
      if (lStack_550 == lVar1) {
        uv_fs_req_cleanup(auStack_5c8);
        iVar3 = uv_fs_req_cleanup(pcVar7);
        result_check_count = result_check_count + 1;
        return iVar3;
      }
      goto LAB_001504f0;
    }
  }
  else {
    handle_result_cold_1();
LAB_001504dc:
    handle_result_cold_2();
LAB_001504e1:
    handle_result_cold_3();
LAB_001504e6:
    handle_result_cold_4();
  }
  handle_result_cold_5();
LAB_001504f0:
  handle_result_cold_6();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
          ,0x2a,"fail_cb should not have been called");
  fflush(_stderr);
  abort();
}

Assistant:

TEST_IMPL(fs_copyfile) {
  const char src[] = "test_file_src";
  uv_loop_t* loop;
  uv_fs_t req;
  int r;

  loop = uv_default_loop();

  /* Fails with EINVAL if bad flags are passed. */
  r = uv_fs_copyfile(NULL, &req, src, dst, -1, NULL);
  ASSERT(r == UV_EINVAL);
  uv_fs_req_cleanup(&req);

  /* Fails with ENOENT if source does not exist. */
  unlink(src);
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT(req.result == UV_ENOENT);
  ASSERT(r == UV_ENOENT);
  uv_fs_req_cleanup(&req);
  /* The destination should not exist. */
  r = uv_fs_stat(NULL, &req, dst, NULL);
  ASSERT(r != 0);
  uv_fs_req_cleanup(&req);

  /* Succeeds if src and dst files are identical. */
  touch_file(src, 12);
  r = uv_fs_copyfile(NULL, &req, src, src, 0, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&req);
  unlink(src);

  /* Copies file synchronously. Creates new file. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Copies a file of size zero. */
  unlink(dst);
  touch_file(src, 0);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Copies file synchronously. Overwrites existing file. */
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Fails to overwrites existing file. */
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_EXCL, NULL);
  ASSERT(r == UV_EEXIST);
  uv_fs_req_cleanup(&req);

  /* Truncates when an existing destination is larger than the source file. */
  touch_file(src, 1);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Copies a larger file. */
  unlink(dst);
  touch_file(src, 4096 * 2);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);
  unlink(src);

  /* Copies file asynchronously */
  unlink(dst);
  r = uv_fs_copyfile(loop, &req, fixture, dst, 0, handle_result);
  ASSERT(r == 0);
  ASSERT(result_check_count == 5);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(result_check_count == 6);

  /* If the flags are invalid, the loop should not be kept open */
  unlink(dst);
  r = uv_fs_copyfile(loop, &req, fixture, dst, -1, fail_cb);
  ASSERT(r == UV_EINVAL);
  uv_run(loop, UV_RUN_DEFAULT);

  /* Copies file using UV_FS_COPYFILE_FICLONE. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_FICLONE, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Copies file using UV_FS_COPYFILE_FICLONE_FORCE. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_FICLONE_FORCE,
                     NULL);
  ASSERT(r <= 0);

  if (r == 0)
    handle_result(&req);

#ifndef _WIN32
  /* Copying respects permissions/mode. */
  unlink(dst);
  touch_file(dst, 0);
  chmod(dst, S_IRUSR|S_IRGRP|S_IROTH); /* Sets file mode to 444 (read-only). */
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  /* On IBMi PASE, qsecofr users can overwrite read-only files */
# ifndef __PASE__
  ASSERT(req.result == UV_EACCES);
  ASSERT(r == UV_EACCES);
# endif
  uv_fs_req_cleanup(&req);
#endif

  unlink(dst); /* Cleanup */
  return 0;
}